

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void cp_reg_reset(gpointer key,gpointer value,gpointer opaque)

{
  long lVar1;
  ARMCPU_conflict *cpu;
  
  if ((*(uint *)((long)value + 0x14) & 0x21) == 0) {
    if (*(code **)((long)value + 0x70) != (code *)0x0) {
      (**(code **)((long)value + 0x70))((long)opaque + 0xa350);
      return;
    }
    lVar1 = *(long *)((long)value + 0x30);
    if (lVar1 != 0) {
      if (((*(uint *)((long)value + 0x14) & 4) == 0) && (*(int *)((long)value + 0x10) != 1)) {
        *(int *)((long)opaque + lVar1 + 0xa350) = (int)*(undefined8 *)((long)value + 0x28);
        return;
      }
      *(undefined8 *)((long)opaque + lVar1 + 0xa350) = *(undefined8 *)((long)value + 0x28);
      return;
    }
  }
  return;
}

Assistant:

static void cp_reg_reset(gpointer key, gpointer value, gpointer opaque)
{
    /* Reset a single ARMCPRegInfo register */
    ARMCPRegInfo *ri = value;
    ARMCPU *cpu = opaque;

    if (ri->type & (ARM_CP_SPECIAL | ARM_CP_ALIAS)) {
        return;
    }

    if (ri->resetfn) {
        ri->resetfn(&cpu->env, ri);
        return;
    }

    /* A zero offset is never possible as it would be regs[0]
     * so we use it to indicate that reset is being handled elsewhere.
     * This is basically only used for fields in non-core coprocessors
     * (like the pxa2xx ones).
     */
    if (!ri->fieldoffset) {
        return;
    }

    if (cpreg_field_is_64bit(ri)) {
        CPREG_FIELD64(&cpu->env, ri) = ri->resetvalue;
    } else {
        CPREG_FIELD32(&cpu->env, ri) = ri->resetvalue;
    }
}